

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

void __thiscall Js::PathTypeHandlerBase::DumpFixedFields(PathTypeHandlerBase *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  PropertyRecord *pPVar5;
  Data *pDVar6;
  TypePath *this_00;
  uint uVar7;
  
  uVar4 = (this->super_DynamicTypeHandler).unusedBytes;
  if (DAT_015bf361 == '\0') {
    if (1 < uVar4) {
      uVar7 = 0;
      do {
        pPVar5 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,uVar7);
        Output::Print(L" %s %d%d%d,",pPVar5 + 1,1,0,0);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (this->super_DynamicTypeHandler).unusedBytes >> 1);
    }
  }
  else if (1 < uVar4) {
    uVar7 = 0;
    do {
      this_00 = (this->typePath).ptr;
      pDVar6 = (this_00->data).ptr;
      if (uVar7 < pDVar6->pathLength) {
        pPVar5 = TypePath::GetPropertyIdUnchecked(this_00,uVar7);
        this_00 = (this->typePath).ptr;
        pDVar6 = (this_00->data).ptr;
        uVar4 = (this->super_DynamicTypeHandler).unusedBytes;
      }
      else {
        pPVar5 = (PropertyRecord *)0x0;
      }
      bVar1 = pDVar6->maxInitializedLength;
      bVar2 = TypePath::GetIsFixedFieldAt(this_00,(PropertyIndex)uVar7,(uint)(uVar4 >> 1));
      bVar3 = TypePath::GetIsUsedFixedFieldAt
                        ((this->typePath).ptr,(PropertyIndex)uVar7,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      Output::Print(L" %s %d%d%d,",pPVar5 + 1,(ulong)(uVar7 < bVar1),(ulong)bVar2,(ulong)bVar3);
      uVar7 = uVar7 + 1;
      uVar4 = (this->super_DynamicTypeHandler).unusedBytes;
    } while (uVar7 < uVar4 >> 1);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::DumpFixedFields() const {
        if (FixPropsOnPathTypes())
        {
            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetTypePath()->GetPropertyId(i)->GetBuffer(),
                    i < this->GetTypePath()->GetMaxInitializedLength() ? 1 : 0,
                    this->GetTypePath()->GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    this->GetTypePath()->GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }
        }
        else
        {
            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetTypePath()->GetPropertyId(i)->GetBuffer(), 1, 0, 0);
            }
        }
    }